

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionController_SetAssetIssuanceTest1_Test::TestBody
          (ConfidentialTransactionController_SetAssetIssuanceTest1_Test *this)

{
  pointer *ppuVar1;
  undefined8 lhs;
  bool bVar2;
  int iVar3;
  undefined1 extraout_DL;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> extraout_DL_00;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  AssertionResult gtest_ar_1;
  pointer in_stack_fffffffffffff9b8;
  pointer in_stack_fffffffffffff9c0;
  undefined1 local_620 [32];
  ConfidentialAssetId local_600;
  ConfidentialAssetId local_5d8;
  AssertionResult gtest_ar;
  undefined1 local_578 [40];
  undefined1 local_550 [16];
  IssuanceParameter param;
  Txid txid;
  ByteData256 contract_hash;
  ByteData local_498;
  ConfidentialTransactionController tx;
  ConfidentialTransactionController expect_tx;
  Address asset_address;
  undefined1 *local_3d0 [2];
  undefined1 local_3c0 [16];
  void *local_3b0;
  void *local_398;
  void *local_380;
  code *local_368 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_2f0;
  Script local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_298;
  Txid local_268;
  undefined **local_248;
  void *local_240;
  undefined **local_220;
  void *local_218;
  ConfidentialTransactionController tx_base;
  Address token_address;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  void *local_178;
  void *local_160;
  void *local_148;
  code *local_130 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  _asset_address = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&asset_address,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,"");
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&tx_base,(string *)&asset_address);
  if (_asset_address != local_3d0) {
    operator_delete(_asset_address);
  }
  _asset_address = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&asset_address,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000"
             ,"");
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&expect_tx,(string *)&asset_address);
  if (_asset_address != local_3d0) {
    operator_delete(_asset_address);
  }
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&tx,&tx_base);
  _asset_address = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&asset_address,
             "c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f","");
  cfd::core::Txid::Txid(&txid,(string *)&asset_address);
  if (_asset_address != local_3d0) {
    operator_delete(_asset_address);
  }
  local_550._0_8_ = cfd::core::Amount::CreateByCoinAmount(100.0);
  local_550[8] = extraout_DL;
  local_578._24_8_ = cfd::core::Amount::CreateByCoinAmount(10.0);
  local_578[0x20] = extraout_DL_00;
  _token_address = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&token_address,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z","");
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&asset_address,(string *)&token_address,(vector *)&param);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &param);
  if (_token_address != local_198) {
    operator_delete(_token_address);
  }
  ppuVar1 = (pointer *)
            ((long)&param.entropy.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  param.entropy._vptr_BlindFactor = (_func_int **)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&param,"2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG","");
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&token_address,(string *)&param,(vector *)local_620);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_620);
  if (param.entropy._vptr_BlindFactor != (_func_int **)ppuVar1) {
    operator_delete(param.entropy._vptr_BlindFactor);
  }
  cfd::core::ByteData256::ByteData256(&contract_hash);
  cfd::core::BlindFactor::BlindFactor(&param.entropy);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&param.asset);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&param.token);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::Address::GetLockingScript();
      cfd::core::ByteData::ByteData((ByteData *)local_578);
      cfd::core::Address::GetLockingScript();
      cfd::core::ByteData::ByteData(&local_498);
      cfd::ConfidentialTransactionController::SetAssetIssuance
                ((Txid *)local_620,(uint)&tx,(Amount *)&txid,(Script *)0x1,(ByteData *)local_550,
                 (Amount *)&gtest_ar_1,(Script *)local_578,(ByteData *)(local_578 + 0x18),
                 SUB81(&gtest_ar,0),(ByteData256 *)&local_498,false,SUB81(&contract_hash,0));
      cfd::core::BlindFactor::operator=(&param.entropy,(BlindFactor *)local_620);
      cfd::core::ConfidentialAssetId::operator=(&param.asset,&local_600);
      cfd::core::ConfidentialAssetId::operator=(&param.token,&local_5d8);
      local_5d8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002e2170;
      if (local_5d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5d8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_600._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002e2170;
      if (local_600.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_600.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_620._0_8_ = &PTR__BlindFactor_002e1f10;
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete((void *)local_620._8_8_);
      }
      if (local_498.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_498.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::Script::~Script((Script *)&gtest_ar);
      if ((_func_int **)local_578._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_578._0_8_);
      }
      cfd::core::Script::~Script((Script *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x4d,
               "Expected: (param = tx.SetAssetIssuance(txid, 1, asset_amount, asset_address.GetLockingScript(), ByteData(), token_amount, token_address.GetLockingScript(), ByteData(), is_blind, contract_hash, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_620._0_8_ + 8))();
      }
      local_620._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  lhs = local_620._0_8_;
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",(char *)lhs,
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  if ((undefined1 *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != &stack0xfffffffffffff9b8) {
    operator_delete((undefined1 *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_620 + 0x10))
  {
    operator_delete((void *)local_620._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_620);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x4e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_620._0_8_ + 8))();
      }
      local_620._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::BlindFactor::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",
             (char *)local_620._0_8_,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_620 + 0x10))
  {
    operator_delete((void *)local_620._0_8_);
  }
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_620);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x51,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_620._0_8_ + 8))();
      }
      local_620._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = 0;
  do {
    cfd::ConfidentialTransactionController::operator=(&tx,&tx_base);
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        cfd::core::Address::GetLockingScript();
        cfd::core::ByteData::ByteData((ByteData *)&gtest_ar);
        cfd::core::Address::GetLockingScript();
        cfd::core::ByteData::ByteData((ByteData *)local_578);
        cfd::ConfidentialTransactionController::SetAssetIssuance
                  (&local_268,(uint)&tx,(Amount *)&txid,(Script *)0x1,(ByteData *)local_550,
                   (Amount *)local_620,(Script *)&gtest_ar,(ByteData *)(local_578 + 0x18),
                   SUB81(&gtest_ar_1,0),(ByteData256 *)local_578,false,SUB81(&contract_hash,0));
        local_220 = &PTR__ConfidentialAssetId_002e2170;
        if (local_218 != (void *)0x0) {
          operator_delete(local_218);
        }
        local_248 = &PTR__ConfidentialAssetId_002e2170;
        if (local_240 != (void *)0x0) {
          operator_delete(local_240);
        }
        local_268._vptr_Txid = (_func_int **)&PTR__BlindFactor_002e1f10;
        if (local_268.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_268.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((_func_int **)local_578._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_578._0_8_);
        }
        cfd::core::Script::~Script((Script *)&gtest_ar_1);
        if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
          operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
        cfd::core::Script::~Script((Script *)local_620);
      }
    }
    else {
      testing::Message::Message((Message *)local_620);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
                 ,0x5d,
                 "Expected: (tx.SetAssetIssuance(txid, 1, asset_amount, asset_address.GetLockingScript(), ByteData(), token_amount, token_address.GetLockingScript(), ByteData(), is_blind, contract_hash, true)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)local_620);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_620._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(_func_int **)local_620._0_8_ + 8))();
        }
        local_620._0_8_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    cfd::AbstractTransactionController::GetHex_abi_cxx11_();
    cfd::AbstractTransactionController::GetHex_abi_cxx11_();
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._8_8_ ==
        gtest_ar_1.message_.ptr_) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = true;
      }
      else {
        iVar3 = bcmp((void *)local_620._0_8_,(void *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_),
                     local_620._8_8_);
        bVar2 = iVar3 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    bVar6 = uVar4 < 9;
    if ((undefined1 *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != &stack0xfffffffffffff9b8) {
      operator_delete((undefined1 *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_620 + 0x10)) {
      operator_delete((void *)local_620._0_8_);
    }
    uVar4 = uVar4 + 1;
  } while ((bool)(bVar2 & bVar6));
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTRNE
            ((char *)in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8,
             (char *)gtest_ar_1.message_.ptr_,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_)
            );
  if ((undefined1 *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != &stack0xfffffffffffff9b8) {
    operator_delete((undefined1 *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_620 + 0x10))
  {
    operator_delete((void *)local_620._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_620);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x60,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_620._0_8_ + 8))();
      }
      local_620._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  param.token._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002e2170;
  if (param.token.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(param.token.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  param.asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002e2170;
  if (param.asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(param.asset.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  param.entropy._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_002e1f10;
  if (param.entropy.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(param.entropy.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(contract_hash.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  cfd::core::Script::~Script(&local_a0);
  local_130[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_130);
  if (local_148 != (void *)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (void *)0x0) {
    operator_delete(local_160);
  }
  if (local_178 != (void *)0x0) {
    operator_delete(local_178);
  }
  if (local_198[0] != local_188) {
    operator_delete(local_198[0]);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_298);
  cfd::core::Script::~Script(&local_2d8);
  local_368[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_2f0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_368);
  if (local_380 != (void *)0x0) {
    operator_delete(local_380);
  }
  if (local_398 != (void *)0x0) {
    operator_delete(local_398);
  }
  if (local_3b0 != (void *)0x0) {
    operator_delete(local_3b0);
  }
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0]);
  }
  txid._vptr_Txid = (_func_int **)&PTR__Txid_002e1e60;
  if (txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(txid.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  tx._0_8_ = &PTR__ConfidentialTransactionController_002e1de8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx.transaction_);
  expect_tx._0_8_ = &PTR__ConfidentialTransactionController_002e1de8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&expect_tx.transaction_);
  tx_base._0_8_ = &PTR__ConfidentialTransactionController_002e1de8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx_base.transaction_);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut)
{
    ConfidentialTransactionController txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
}